

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRewrite.c
# Opt level: O1

void Abc_ManRewritePrintDivs(Vec_Ptr_t *vDivs,int nLeaves)

{
  uint uVar1;
  long *plVar2;
  long *plVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  
  if ((long)vDivs->nSize < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
  }
  if (0 < vDivs->nSize) {
    plVar2 = (long *)vDivs->pArray[(long)vDivs->nSize + -1];
    uVar6 = 0;
    do {
      plVar3 = (long *)vDivs->pArray[uVar6];
      if ((long)uVar6 < (long)nLeaves) {
        printf("%6d : %c\n",(ulong)*(uint *)(plVar3 + 2),(ulong)((int)uVar6 + 0x61));
      }
      else {
        uVar5 = 0;
        printf("%6d : %2d = ",(ulong)*(uint *)(plVar3 + 2),uVar6 & 0xffffffff);
        uVar1 = vDivs->nSize;
        if (0 < (int)uVar1) {
          uVar5 = 0;
          do {
            if (*(void **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8)
                == vDivs->pArray[uVar5]) goto LAB_00307554;
            uVar5 = uVar5 + 1;
          } while (uVar1 != uVar5);
          uVar5 = (ulong)uVar1;
        }
LAB_00307554:
        if ((int)uVar5 < nLeaves) {
          putchar((int)uVar5 + 0x61);
        }
        else {
          printf("%d",uVar5 & 0xffffffff);
        }
        pcVar4 = "\'";
        if ((*(uint *)((long)plVar3 + 0x14) >> 10 & 1) == 0) {
          pcVar4 = "";
        }
        uVar5 = 0;
        printf("%s ",pcVar4);
        uVar1 = vDivs->nSize;
        if (0 < (int)uVar1) {
          uVar5 = 0;
          do {
            if (*(void **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                          (long)*(int *)(plVar3[4] + 4) * 8) == vDivs->pArray[uVar5])
            goto LAB_003075d9;
            uVar5 = uVar5 + 1;
          } while (uVar1 != uVar5);
          uVar5 = (ulong)uVar1;
        }
LAB_003075d9:
        if ((int)uVar5 < nLeaves) {
          putchar((int)uVar5 + 0x61);
        }
        else {
          printf("%d",uVar5 & 0xffffffff);
        }
        pcVar4 = "\'";
        if ((*(uint *)((long)plVar3 + 0x14) >> 0xb & 1) == 0) {
          pcVar4 = "";
        }
        printf("%s ",pcVar4);
        if (plVar3 == plVar2) {
          printf(" root");
        }
        putchar(10);
      }
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < (long)vDivs->nSize);
  }
  putchar(10);
  return;
}

Assistant:

void Abc_ManRewritePrintDivs( Vec_Ptr_t * vDivs, int nLeaves )
{
    Abc_Obj_t * pFanin, * pNode, * pRoot;
    int i, k;
    pRoot = (Abc_Obj_t *)Vec_PtrEntryLast(vDivs);
    // print the nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vDivs, pNode, i )
    {
        if ( i < nLeaves )
        {
            printf( "%6d : %c\n", pNode->Id, 'a'+i );
            continue;
        }
        printf( "%6d : %2d = ", pNode->Id, i );
        // find the first fanin
        Vec_PtrForEachEntry( Abc_Obj_t *, vDivs, pFanin, k )
            if ( Abc_ObjFanin0(pNode) == pFanin )
                break;
        if ( k < nLeaves )
            printf( "%c", 'a' + k );
        else
            printf( "%d", k );
        printf( "%s ", Abc_ObjFaninC0(pNode)? "\'" : "" );
        // find the second fanin
        Vec_PtrForEachEntry( Abc_Obj_t *, vDivs, pFanin, k )
            if ( Abc_ObjFanin1(pNode) == pFanin )
                break;
        if ( k < nLeaves )
            printf( "%c", 'a' + k );
        else
            printf( "%d", k );
        printf( "%s ", Abc_ObjFaninC1(pNode)? "\'" : "" );
        if ( pNode == pRoot )
            printf( " root" );
        printf( "\n" );
    }
    printf( "\n" );
}